

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t helper_clclu(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  ulong uVar1;
  uint32_t uVar2;
  uintptr_t unaff_retaddr;
  uint64_t src1;
  ulong local_60;
  uint64_t local_58;
  long local_50;
  uint64_t src3;
  uint64_t src1len;
  uint64_t src3len;
  
  local_50 = (long)(int)(r1 + 1);
  uVar1 = (env->psw).mask;
  src1len = env->regs[local_50] & 0x7fffffff;
  if ((uVar1 >> 0x20 & 1) != 0) {
    src1len = env->regs[local_50];
  }
  local_58 = a2;
  src1 = get_address(env,r1);
  src3len = env->regs[(int)(r3 + 1)] & 0x7fffffff;
  if ((uVar1 >> 0x20 & 1) != 0) {
    src3len = env->regs[(int)(r3 + 1)];
  }
  local_60 = (ulong)r3;
  src3 = get_address(env,r3);
  uVar2 = do_clcl(env,&src1,&src1len,&src3,&src3len,(uint16_t)local_58,0x1000,2,unaff_retaddr);
  set_length(env,(int)local_50,src1len);
  set_length(env,r3 + 1,src3len);
  set_address(env,r1,src1);
  set_address(env,(int)local_60,src3);
  return uVar2;
}

Assistant:

uint32_t HELPER(clclu)(CPUS390XState *env, uint32_t r1, uint64_t a2,
                       uint32_t r3)
{
    uintptr_t ra = GETPC();
    uint64_t src1len = get_length(env, r1 + 1);
    uint64_t src1 = get_address(env, r1);
    uint64_t src3len = get_length(env, r3 + 1);
    uint64_t src3 = get_address(env, r3);
    uint16_t pad = a2;
    uint32_t cc = 0;

    cc = do_clcl(env, &src1, &src1len, &src3, &src3len, pad, 0x1000, 2, ra);

    set_length(env, r1 + 1, src1len);
    set_length(env, r3 + 1, src3len);
    set_address(env, r1, src1);
    set_address(env, r3, src3);

    return cc;
}